

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# star_expression.cpp
# Opt level: O2

void __thiscall duckdb::StarExpression::StarExpression(StarExpression *this,string *relation_name_p)

{
  (this->super_ParsedExpression).super_BaseExpression.type = STAR;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = STAR;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__StarExpression_027a75a0;
  ::std::__cxx11::string::string((string *)&this->relation_name,(string *)relation_name_p);
  (this->exclude_list)._M_h._M_buckets = &(this->exclude_list)._M_h._M_single_bucket;
  (this->exclude_list)._M_h._M_bucket_count = 1;
  (this->exclude_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->exclude_list)._M_h._M_element_count = 0;
  (this->exclude_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->exclude_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->exclude_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->replace_list)._M_h._M_buckets = &(this->replace_list)._M_h._M_single_bucket;
  (this->replace_list)._M_h._M_bucket_count = 1;
  (this->replace_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->replace_list)._M_h._M_element_count = 0;
  (this->replace_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->replace_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->replace_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->rename_list)._M_h._M_buckets = &(this->rename_list)._M_h._M_single_bucket;
  (this->rename_list)._M_h._M_bucket_count = 1;
  (this->rename_list)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->rename_list)._M_h._M_element_count = 0;
  (this->rename_list)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->rename_list)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->rename_list)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)((long)&(this->rename_list)._M_h._M_single_bucket + 1) = 0;
  *(undefined8 *)
   ((long)&(this->expr).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false> + 1) = 0;
  return;
}

Assistant:

StarExpression::StarExpression(string relation_name_p)
    : ParsedExpression(ExpressionType::STAR, ExpressionClass::STAR), relation_name(std::move(relation_name_p)) {
}